

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::anon_unknown_0::ExtensionSetTest_Proto3PackedDynamicExtensions_Test::
TestBody(ExtensionSetTest_Proto3PackedDynamicExtensions_Test *this)

{
  pointer pcVar1;
  bool bVar2;
  internal iVar3;
  int iVar4;
  void *pvVar5;
  DescriptorPool *underlay;
  Arena *pAVar6;
  pointer *__ptr_2;
  char *pcVar7;
  char *in_R9;
  pointer *__ptr_1;
  pointer *__ptr;
  Metadata MVar8;
  string_view sVar9;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  string reserialized_options;
  UnknownFieldSet unknown_fields;
  string serialized_options;
  MessageOptions message_options;
  CodedInputStream coded_stream;
  ArrayInputStream input_stream;
  DynamicMessageFactory factory;
  DescriptorPool pool;
  FileDescriptorProto file_descriptor_proto;
  AssertHelper local_338;
  Message local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  undefined1 local_320 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  undefined1 local_300 [32];
  AssertHelper local_2e0;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_2d8;
  string local_2c0;
  undefined1 local_2a0 [8];
  InternalMetadata local_298;
  anon_union_72_1_493b367e_for_MessageOptions_3 local_290;
  undefined1 local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_240;
  ArrayInputStream *local_238;
  undefined7 local_230;
  undefined1 uStack_229;
  undefined7 uStack_228;
  undefined8 local_220;
  int local_218;
  int local_214;
  int local_210;
  DescriptorPool *local_208;
  DynamicMessageFactory *pDStack_200;
  ArrayInputStream local_1f8;
  DynamicMessageFactory local_1d8;
  DescriptorPool local_198;
  undefined1 local_120 [120];
  RepeatedPtrFieldBase local_a8 [3];
  ArenaStringPtr local_58;
  ArenaStringPtr local_50;
  ArenaStringPtr local_48 [4];
  
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_120,(Arena *)0x0);
  local_120[0x10] = local_120[0x10] | 4;
  pAVar6 = (Arena *)local_120._8_8_;
  if ((local_120._8_8_ & 1) != 0) {
    pAVar6 = *(Arena **)(local_120._8_8_ & 0xfffffffffffffffe);
  }
  sVar9._M_str = "proto3";
  sVar9._M_len = 6;
  ArenaStringPtr::Set(local_48,sVar9,pAVar6);
  local_120[0x10] = local_120[0x10] | 1;
  pAVar6 = (Arena *)local_120._8_8_;
  if ((local_120._8_8_ & 1) != 0) {
    pAVar6 = *(Arena **)(local_120._8_8_ & 0xfffffffffffffffe);
  }
  value._M_str = "google/protobuf/unittest_proto3_packed_extension.proto";
  value._M_len = 0x36;
  ArenaStringPtr::Set(&local_58,value,pAVar6);
  local_120[0x10] = local_120[0x10] | 2;
  if ((local_120._8_8_ & 1) != 0) {
    local_120._8_8_ = *(undefined8 *)(local_120._8_8_ & 0xfffffffffffffffe);
  }
  value_00._M_str = "proto3_unittest";
  value_00._M_len = 0xf;
  ArenaStringPtr::Set(&local_50,value_00,(Arena *)local_120._8_8_);
  MVar8 = DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
  pcVar1 = ((MVar8.descriptor)->file_->name_->_M_dataplus)._M_p;
  pvVar5 = RepeatedPtrFieldBase::AddString((RepeatedPtrFieldBase *)(local_120 + 0x18));
  std::__cxx11::string::_M_replace((ulong)pvVar5,0,*(char **)((long)pvVar5 + 8),(ulong)pcVar1);
  pvVar5 = RepeatedPtrFieldBase::AddMessageLite
                     (local_a8,Arena::DefaultConstruct<google::protobuf::FieldDescriptorProto>);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_01._M_str = "repeated_int32_option";
  value_01._M_len = 0x15;
  ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x18),value_01,pAVar6);
  MessageOptions::MessageOptions((MessageOptions *)&local_198,(Arena *)0x0);
  sVar9 = MessageLite::GetTypeName((MessageLite *)&local_198);
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 2;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x20),sVar9,pAVar6);
  MessageOptions::~MessageOptions((MessageOptions *)&local_198);
  *(undefined4 *)((long)pvVar5 + 0x48) = 0xc359;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 0x40;
  bVar2 = ValidateEnum(3,(uint32_t *)&FieldDescriptorProto_Label_internal_data_);
  if (!bVar2) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Label_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x3a33,
                  "void google::protobuf::FieldDescriptorProto::_internal_set_label(::google::protobuf::FieldDescriptorProto_Label)"
                 );
  }
  *(undefined4 *)((long)pvVar5 + 0x54) = 3;
  *(byte *)((long)pvVar5 + 0x11) = *(byte *)((long)pvVar5 + 0x11) | 2;
  bVar2 = ValidateEnum(5,(uint32_t *)&FieldDescriptorProto_Type_internal_data_);
  if (!bVar2) {
    __assert_fail("::google::protobuf::internal::ValidateEnum( value, ::google::protobuf::FieldDescriptorProto_Type_internal_data_)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.h"
                  ,0x3a52,
                  "void google::protobuf::FieldDescriptorProto::_internal_set_type(::google::protobuf::FieldDescriptorProto_Type)"
                 );
  }
  *(undefined4 *)((long)pvVar5 + 0x58) = 5;
  *(uint *)((long)pvVar5 + 0x10) = *(uint *)((long)pvVar5 + 0x10) | 0x410;
  pAVar6 = *(Arena **)((long)pvVar5 + 8);
  if (((ulong)pAVar6 & 1) != 0) {
    pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
  }
  value_02._M_str = "repeatedInt32Option";
  value_02._M_len = 0x13;
  ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x38),value_02,pAVar6);
  underlay = DescriptorPool::generated_pool();
  DescriptorPool::DescriptorPool(&local_198,underlay);
  local_248 = (undefined1  [8])
              DescriptorPool::BuildFile(&local_198,(FileDescriptorProto *)local_120);
  local_1d8.super_MessageFactory._vptr_MessageFactory = (_func_int **)0x0;
  testing::internal::CmpHelperNE<google::protobuf::FileDescriptor_const*,decltype(nullptr)>
            ((internal *)local_2a0,"pool.BuildFile(file_descriptor_proto)","nullptr",
             (FileDescriptor **)local_248,(void **)&local_1d8);
  if (local_2a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_248);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar7 = anon_var_dwarf_a12c75 + 5;
    }
    else {
      pcVar7 = *(char **)local_298.ptr_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x55e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if (local_248 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_248 + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_298.ptr_);
    }
    goto LAB_006a093b;
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298.ptr_
                );
  }
  DynamicMessageFactory::DynamicMessageFactory(&local_1d8);
  local_1d8.delegate_to_generated_factory_ = true;
  local_2d8.long_rep.elements_int = 0;
  local_2d8.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
  UnknownFieldSet::AddVarint((UnknownFieldSet *)&local_2d8.long_rep,0xc359,1);
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  bVar2 = UnknownFieldSet::SerializeToString((UnknownFieldSet *)&local_2d8.long_rep,&local_2c0);
  local_248[0] = bVar2;
  pbStack_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar2) {
LAB_006a0530:
    io::ArrayInputStream::ArrayInputStream
              (&local_1f8,local_2c0._M_dataplus._M_p,(int)local_2c0._M_string_length,-1);
    local_248 = (undefined1  [8])0x0;
    pbStack_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_230 = 0;
    uStack_229 = 0;
    uStack_228._0_4_ = 0;
    uStack_228._4_1_ = false;
    uStack_228._5_1_ = false;
    uStack_228._6_1_ = false;
    local_220._0_4_ = 0x7fffffff;
    local_220._4_4_ = 0;
    local_218 = 0x7fffffff;
    local_214 = io::CodedInputStream::default_recursion_limit_;
    local_210 = io::CodedInputStream::default_recursion_limit_;
    local_208 = (DescriptorPool *)0x0;
    pDStack_200 = (DynamicMessageFactory *)0x0;
    local_238 = &local_1f8;
    io::CodedInputStream::Refresh((CodedInputStream *)local_248);
    local_208 = &local_198;
    pDStack_200 = &local_1d8;
    MessageOptions::MessageOptions((MessageOptions *)local_2a0,(Arena *)0x0);
    iVar3 = (internal)
            MessageLite::ParseFromCodedStream
                      ((MessageLite *)local_2a0,(CodedInputStream *)local_248);
    local_318 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_320[0] = iVar3;
    if ((bool)iVar3) {
LAB_006a068a:
      local_300._8_8_ = 0;
      local_300[0x10] = '\0';
      local_300._0_8_ = (AssertHelperData *)(local_300 + 0x10);
      iVar3 = (internal)MessageLite::SerializeToString((MessageLite *)local_2a0,(string *)local_300)
      ;
      local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_330.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ = iVar3;
      if ((bool)iVar3) {
LAB_006a0774:
        testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
                  ((internal *)local_320,"reserialized_options","\"\\xca\\xb5\\x18\\x01\\x01\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300,
                   &anon_var_dwarf_a12c75);
        if (local_320[0] == (internal)0x0) {
          testing::Message::Message(&local_330);
          if (local_318 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar7 = anon_var_dwarf_a12c75 + 5;
          }
          else {
            pcVar7 = (local_318->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_338,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                     ,0x575,pcVar7);
          testing::internal::AssertHelper::operator=(&local_338,&local_330);
          testing::internal::AssertHelper::~AssertHelper(&local_338);
          if ((long *)CONCAT71(local_330.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._1_7_,
                               local_330.ss_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl._0_1_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(local_330.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._1_7_,
                                           local_330.ss_._M_t.
                                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           .
                                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                           ._M_head_impl._0_1_) + 8))();
          }
        }
        if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_318,local_318);
        }
      }
      else {
        testing::Message::Message((Message *)&local_338);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_320,(internal *)&local_330,
                   (AssertionResult *)"message_options.SerializeToString(&reserialized_options)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                   ,0x574,(char *)CONCAT71(local_320._1_7_,local_320[0]));
        testing::internal::AssertHelper::operator=(&local_2e0,(Message *)&local_338);
        testing::internal::AssertHelper::~AssertHelper(&local_2e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_320._1_7_,local_320[0]) != &local_310) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_320._1_7_,local_320[0]),
                          local_310._M_allocated_capacity + 1);
        }
        if (local_338.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_338.data_ + 8))();
        }
        if (local_328 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_328,local_328);
        }
        if ((bool)iVar3) goto LAB_006a0774;
      }
      if ((AssertHelperData *)local_300._0_8_ != (AssertHelperData *)(local_300 + 0x10)) {
        operator_delete((void *)local_300._0_8_,CONCAT71(local_300._17_7_,local_300[0x10]) + 1);
      }
    }
    else {
      testing::Message::Message(&local_330);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_300,(internal *)local_320,
                 (AssertionResult *)"message_options.ParseFromCodedStream(&coded_stream)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_338,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
                 ,0x56f,(char *)local_300._0_8_);
      testing::internal::AssertHelper::operator=(&local_338,&local_330);
      testing::internal::AssertHelper::~AssertHelper(&local_338);
      if ((AssertHelperData *)local_300._0_8_ != (AssertHelperData *)(local_300 + 0x10)) {
        operator_delete((void *)local_300._0_8_,CONCAT71(local_300._17_7_,local_300[0x10]) + 1);
      }
      if ((long *)CONCAT71(local_330.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._1_7_,
                           local_330.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._0_1_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT71(local_330.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._1_7_,
                                       local_330.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_1_) + 8))();
      }
      if (local_318 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_318,local_318);
      }
      if ((bool)iVar3) goto LAB_006a068a;
    }
    MessageOptions::~MessageOptions((MessageOptions *)local_2a0);
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)local_248);
  }
  else {
    testing::Message::Message((Message *)&local_1f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_248,
               (AssertionResult *)"unknown_fields.SerializeToString(&serialized_options)","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_300,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_unittest.cc"
               ,0x567,(char *)CONCAT71(local_2a0._1_7_,local_2a0[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)local_300,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_300);
    if ((anon_union_72_1_493b367e_for_MessageOptions_3 *)CONCAT71(local_2a0._1_7_,local_2a0[0]) !=
        &local_290) {
      operator_delete((anon_union_72_1_493b367e_for_MessageOptions_3 *)
                      CONCAT71(local_2a0._1_7_,local_2a0[0]),
                      (ulong)((long)&((local_290._impl_._extensions_.arena_)->impl_).tag_and_id_ + 1
                             ));
    }
    if (local_1f8.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream != (_func_int **)0x0) {
      (**(code **)(*local_1f8.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream + 8))();
    }
    if (pbStack_240 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_240,pbStack_240);
    }
    if (bVar2) goto LAB_006a0530;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  iVar4 = SooRep::size((SooRep *)&local_2d8.long_rep,(local_2d8.long_rep.elements_int & 4) == 0);
  if (iVar4 != 0) {
    UnknownFieldSet::ClearFallback((UnknownFieldSet *)&local_2d8.long_rep);
  }
  RepeatedField<google::protobuf::UnknownField>::~RepeatedField
            ((RepeatedField<google::protobuf::UnknownField> *)&local_2d8.long_rep);
  DynamicMessageFactory::~DynamicMessageFactory(&local_1d8);
LAB_006a093b:
  DescriptorPool::~DescriptorPool(&local_198);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_120);
  return;
}

Assistant:

TEST(ExtensionSetTest, Proto3PackedDynamicExtensions) {
  // Regression test for b/271121265. This test case verifies that
  // packed-by-default repeated custom options in proto3 are correctly
  // serialized in packed form when dynamic extensions are used.

  // Create a custom option in proto3 and load this into an overlay
  // DescriptorPool with a DynamicMessageFactory.
  google::protobuf::FileDescriptorProto file_descriptor_proto;
  file_descriptor_proto.set_syntax("proto3");
  file_descriptor_proto.set_name(
      "google/protobuf/unittest_proto3_packed_extension.proto");
  file_descriptor_proto.set_package("proto3_unittest");
  file_descriptor_proto.add_dependency(
      DescriptorProto::descriptor()->file()->name());
  FieldDescriptorProto* extension = file_descriptor_proto.add_extension();
  extension->set_name("repeated_int32_option");
  extension->set_extendee(MessageOptions().GetTypeName());
  extension->set_number(50009);
  extension->set_label(FieldDescriptorProto::LABEL_REPEATED);
  extension->set_type(FieldDescriptorProto::TYPE_INT32);
  extension->set_json_name("repeatedInt32Option");
  google::protobuf::DescriptorPool pool(DescriptorPool::generated_pool());
  ASSERT_NE(pool.BuildFile(file_descriptor_proto), nullptr);
  DynamicMessageFactory factory;
  factory.SetDelegateToGeneratedFactory(true);

  // Create a serialized MessageOptions proto equivalent to:
  // [proto3_unittest.repeated_int32_option]: 1
  UnknownFieldSet unknown_fields;
  unknown_fields.AddVarint(50009, 1);
  std::string serialized_options;
  ASSERT_TRUE(unknown_fields.SerializeToString(&serialized_options));

  // Parse the MessageOptions using our custom extension registry.
  io::ArrayInputStream input_stream(serialized_options.data(),
                                    serialized_options.size());
  io::CodedInputStream coded_stream(&input_stream);
  coded_stream.SetExtensionRegistry(&pool, &factory);
  MessageOptions message_options;
  ASSERT_TRUE(message_options.ParseFromCodedStream(&coded_stream));

  // Finally, serialize the proto again and verify that the repeated option has
  // been correctly serialized in packed form.
  std::string reserialized_options;
  ASSERT_TRUE(message_options.SerializeToString(&reserialized_options));
  EXPECT_EQ(reserialized_options, "\xca\xb5\x18\x01\x01");
}